

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O0

void __thiscall
cmTargetPropCommandBase::cmTargetPropCommandBase
          (cmTargetPropCommandBase *this,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  cmExecutionStatus *status_local;
  cmTargetPropCommandBase *this_local;
  
  this->_vptr_cmTargetPropCommandBase = (_func_int **)&PTR__cmTargetPropCommandBase_00faf620;
  std::__cxx11::string::string((string *)&this->Property);
  this->Target = (cmTarget *)0x0;
  pcVar1 = cmExecutionStatus::GetMakefile(status);
  this->Makefile = pcVar1;
  this->Status = status;
  return;
}

Assistant:

cmTargetPropCommandBase::cmTargetPropCommandBase(cmExecutionStatus& status)
  : Makefile(&status.GetMakefile())
  , Status(status)
{
}